

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

void __thiscall duckdb::DropInfo::Serialize(DropInfo *this,Serializer *serializer)

{
  (*serializer->_vptr_Serializer[2])(serializer,100,"info_type");
  Serializer::WriteValue<duckdb::ParseInfoType>(serializer,(this->super_ParseInfo).info_type);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,200,"type");
  Serializer::WriteValue<duckdb::CatalogType>(serializer,(this->super_ParseInfo).field_0x9);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xc9,"catalog",&this->catalog);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>(serializer,0xca,"schema",&this->schema)
  ;
  Serializer::WritePropertyWithDefault<std::__cxx11::string>(serializer,0xcb,"name",&this->name);
  (*serializer->_vptr_Serializer[2])(serializer,0xcc,"if_not_found");
  Serializer::WriteValue<duckdb::OnEntryNotFound>(serializer,this->if_not_found);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<bool>(serializer,0xcd,"cascade",&this->cascade);
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0xce,"allow_drop_internal",&this->allow_drop_internal);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ExtraDropInfo,std::default_delete<duckdb::ExtraDropInfo>,true>>
            (serializer,0xcf,"extra_drop_info",&this->extra_drop_info);
  return;
}

Assistant:

void DropInfo::Serialize(Serializer &serializer) const {
	ParseInfo::Serialize(serializer);
	serializer.WriteProperty<CatalogType>(200, "type", type);
	serializer.WritePropertyWithDefault<string>(201, "catalog", catalog);
	serializer.WritePropertyWithDefault<string>(202, "schema", schema);
	serializer.WritePropertyWithDefault<string>(203, "name", name);
	serializer.WriteProperty<OnEntryNotFound>(204, "if_not_found", if_not_found);
	serializer.WritePropertyWithDefault<bool>(205, "cascade", cascade);
	serializer.WritePropertyWithDefault<bool>(206, "allow_drop_internal", allow_drop_internal);
	serializer.WritePropertyWithDefault<unique_ptr<ExtraDropInfo>>(207, "extra_drop_info", extra_drop_info);
}